

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_for_bench.cpp
# Opt level: O3

int main(void)

{
  Logger *this;
  EventLoop base_loop;
  EchoServer server;
  EventLoop local_350;
  EchoServer local_2e0;
  
  this = Logger::get_instance();
  Logger::init(this,(EVP_PKEY_CTX *)0x0);
  EventLoop::EventLoop(&local_350);
  EchoServer::EchoServer(&local_2e0,&local_350,"127.0.0.1",0x22b9);
  local_2e0.es_server.ts_tcp_conn_timout_ms = 8000;
  local_2e0.es_server.ts_thread_num = 4;
  TcpServer::start(&local_2e0.es_server);
  EventLoop::loop(&local_350);
  TcpServer::~TcpServer(&local_2e0.es_server);
  EventLoop::~EventLoop(&local_350);
  return 0;
}

Assistant:

int main()
{   
    Logger::get_instance()->init(NULL);

    EventLoop base_loop;
    EchoServer server(&base_loop, "127.0.0.1", 8889);
    server.set_tcp_cn_timeout_ms(8000);
    server.start(4);
    base_loop.loop();
    
    return 0;
}